

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall
CCommandLineOptions::SetByCommandLineArguments
          (CCommandLineOptions *this,int numberOfArguments,char **arguments)

{
  bool bVar1;
  long lVar2;
  allocator local_59;
  CFileNames *local_58;
  string local_50;
  
  this->isInfoOnly = false;
  this->isCheckOnly = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->sourceFiles);
  this->optionsEnd = false;
  if (0 < numberOfArguments) {
    lVar2 = 0;
    local_58 = &this->sourceFiles;
    do {
      std::__cxx11::string::string((string *)&local_50,arguments[lVar2],&local_59);
      bVar1 = parseArgument(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (!bVar1) {
        this->isInfoOnly = false;
        this->isCheckOnly = false;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(local_58);
        return false;
      }
    } while ((this->isInfoOnly == false) &&
            (bVar1 = (ulong)(uint)numberOfArguments - 1 != lVar2, lVar2 = lVar2 + 1, bVar1));
  }
  return true;
}

Assistant:

bool CCommandLineOptions::SetByCommandLineArguments( int numberOfArguments,
	const char* const arguments[] )
{
	ResetDefaults();
	optionsEnd = false;
	for( int i = 0; i < numberOfArguments; i++ ) {
		if( !parseArgument( arguments[i] ) ) {
			ResetDefaults();
			return false;
		}
		if( IsInfoOnly() ) {
			break;
		}
	}
	return true;
}